

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonParseAddNode(JsonParse *pParse,u32 eType,u32 n,char *zContent)

{
  JsonNode *pJVar1;
  JsonNode *p;
  char *zContent_local;
  u32 n_local;
  u32 eType_local;
  JsonParse *pParse_local;
  
  if (pParse->nNode < pParse->nAlloc) {
    pJVar1 = pParse->aNode + pParse->nNode;
    pJVar1->eType = (u8)eType;
    pJVar1->jnFlags = '\0';
    pJVar1->n = n;
    (pJVar1->u).zJContent = zContent;
    pParse_local._4_4_ = pParse->nNode;
    pParse->nNode = pParse_local._4_4_ + 1;
  }
  else {
    pParse_local._4_4_ = jsonParseAddNodeExpand(pParse,eType,n,zContent);
  }
  return pParse_local._4_4_;
}

Assistant:

static int jsonParseAddNode(
  JsonParse *pParse,        /* Append the node to this object */
  u32 eType,                /* Node type */
  u32 n,                    /* Content size or sub-node count */
  const char *zContent      /* Content */
){
  JsonNode *p;
  if( pParse->nNode>=pParse->nAlloc ){
    return jsonParseAddNodeExpand(pParse, eType, n, zContent);
  }
  p = &pParse->aNode[pParse->nNode];
  p->eType = (u8)eType;
  p->jnFlags = 0;
  p->n = n;
  p->u.zJContent = zContent;
  return pParse->nNode++;
}